

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_privkey.cpp
# Opt level: O0

void __thiscall Privkey_TweakTest_Test::TestBody(Privkey_TweakTest_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertHelper local_650;
  Message local_648;
  string local_640;
  undefined1 local_620 [8];
  AssertionResult gtest_ar_9;
  Message local_608;
  string local_600;
  undefined1 local_5e0 [8];
  AssertionResult gtest_ar_8;
  Message local_5c8;
  string local_5c0;
  undefined1 local_5a0 [8];
  AssertionResult gtest_ar_7;
  Message local_588;
  string local_580;
  undefined1 local_560 [8];
  AssertionResult gtest_ar_6;
  Message local_548;
  string local_540;
  undefined1 local_520 [8];
  AssertionResult gtest_ar_5;
  Message local_508;
  string local_500;
  undefined1 local_4e0 [8];
  AssertionResult gtest_ar_4;
  Message local_4c8;
  string local_4c0;
  undefined1 local_4a0 [8];
  AssertionResult gtest_ar_3;
  Message local_488;
  string local_480;
  undefined1 local_460 [8];
  AssertionResult gtest_ar_2;
  Message local_448;
  string local_440;
  undefined1 local_420 [8];
  AssertionResult gtest_ar_1;
  Message local_408;
  string local_400;
  undefined1 local_3e0 [8];
  AssertionResult gtest_ar;
  undefined1 local_3c8 [8];
  string exp_sk_m2;
  undefined1 local_3a0 [8];
  string exp_sk_m1;
  undefined1 local_378 [8];
  string exp_sk_c4;
  undefined1 local_350 [8];
  string exp_sk_c3;
  undefined1 local_328 [8];
  string exp_sk_c2;
  undefined1 local_300 [8];
  string exp_sk_c1;
  Privkey local_2c0;
  undefined1 local_2a0 [8];
  Privkey sk_m4;
  Privkey sk_m3;
  Privkey local_240;
  undefined1 local_220 [8];
  Privkey sk_c6;
  Privkey sk_c5;
  Privkey sk_m2;
  Privkey sk_m1;
  Privkey sk_c4;
  Privkey sk_c3;
  Privkey sk_c2;
  Privkey sk_c1;
  Pubkey pk_b;
  Pubkey pk_a;
  string local_e8;
  undefined1 local_c8 [8];
  ByteData256 tweak;
  string local_a8;
  undefined1 local_88 [8];
  Privkey sk_b;
  allocator local_51;
  string local_50;
  undefined1 local_30 [8];
  Privkey sk_a;
  Privkey_TweakTest_Test *this_local;
  
  sk_a._24_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_50,"1d52f68124c59c3125d5c2e043cabf01cef46fafaf45be3132fc1f52ff0ec434",
             &local_51);
  cfd::core::Privkey::Privkey((Privkey *)local_30,&local_50,kMainnet,true);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_a8,"353a88e3c404380d9970d9b2d8ee9f6051b3d817ab32aabc12f5c3c65086e659",
             (allocator *)
             ((long)&tweak.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  cfd::core::Privkey::Privkey((Privkey *)local_88,&local_a8,kMainnet,true);
  std::__cxx11::string::~string((string *)&local_a8);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&tweak.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_e8,"353a88e3c404380d9970d9b2d8ee9f6051b3d817ab32aabc12f5c3c65086e659",
             (allocator *)
             ((long)&pk_a.data_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  cfd::core::ByteData256::ByteData256((ByteData256 *)local_c8,&local_e8);
  std::__cxx11::string::~string((string *)&local_e8);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&pk_a.data_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  cfd::core::Privkey::GetPubkey
            ((Pubkey *)
             &pk_b.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,(Privkey *)local_30);
  cfd::core::Privkey::GetPubkey((Pubkey *)&sk_c1.is_compressed_,(Privkey *)local_88);
  cfd::core::operator+((Privkey *)&sk_c2.is_compressed_,(Privkey *)local_30,(Privkey *)local_88);
  cfd::core::operator-((Privkey *)&sk_c3.is_compressed_,(Privkey *)local_30,(Privkey *)local_88);
  cfd::core::operator+((Privkey *)&sk_c4.is_compressed_,(Privkey *)local_30,(ByteData256 *)local_c8)
  ;
  cfd::core::operator-((Privkey *)&sk_m1.is_compressed_,(Privkey *)local_30,(ByteData256 *)local_c8)
  ;
  cfd::core::operator*((Privkey *)&sk_m2.is_compressed_,(Privkey *)local_30,(Privkey *)local_88);
  cfd::core::operator*((Privkey *)&sk_c5.is_compressed_,(Privkey *)local_30,(ByteData256 *)local_c8)
  ;
  cfd::core::Privkey::Privkey((Privkey *)&sk_c6.is_compressed_,(Privkey *)local_30);
  cfd::core::Privkey::Privkey((Privkey *)local_220,(Privkey *)local_30);
  cfd::core::Privkey::operator+=(&local_240,(Privkey *)&sk_c6.is_compressed_,(Privkey *)local_88);
  cfd::core::Privkey::~Privkey(&local_240);
  cfd::core::Privkey::operator+=
            ((Privkey *)&sk_m3.is_compressed_,(Privkey *)local_220,(ByteData256 *)local_c8);
  cfd::core::Privkey::~Privkey((Privkey *)&sk_m3.is_compressed_);
  cfd::core::Privkey::Privkey((Privkey *)&sk_m4.is_compressed_,(Privkey *)local_30);
  cfd::core::Privkey::Privkey((Privkey *)local_2a0,(Privkey *)local_30);
  cfd::core::Privkey::operator*=(&local_2c0,(Privkey *)&sk_m4.is_compressed_,(Privkey *)local_88);
  cfd::core::Privkey::~Privkey(&local_2c0);
  cfd::core::Privkey::operator*=
            ((Privkey *)((long)&exp_sk_c1.field_2 + 8),(Privkey *)local_2a0,(ByteData256 *)local_c8)
  ;
  cfd::core::Privkey::~Privkey((Privkey *)((long)&exp_sk_c1.field_2 + 8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)local_300,"528d7f64e8c9d43ebf469c931cb95e6220a847c75a7868ed45f1e3194f95aa8d",
             (allocator *)(exp_sk_c2.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(exp_sk_c2.field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)local_328,"e8186d9d60c164238c64e92d6adc1fa037ef747eb35bb3b0dfd8ba197ebe1f1c",
             (allocator *)(exp_sk_c3.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(exp_sk_c3.field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)local_350,"528d7f64e8c9d43ebf469c931cb95e6220a847c75a7868ed45f1e3194f95aa8d",
             (allocator *)(exp_sk_c4.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(exp_sk_c4.field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)local_378,"e8186d9d60c164238c64e92d6adc1fa037ef747eb35bb3b0dfd8ba197ebe1f1c",
             (allocator *)(exp_sk_m1.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(exp_sk_m1.field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)local_3a0,"5ef544d2eb21fcabf9d31d103631fd6da8a653a118e086b5c16b27baa4b1efa0",
             (allocator *)(exp_sk_m2.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(exp_sk_m2.field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)local_3c8,"5ef544d2eb21fcabf9d31d103631fd6da8a653a118e086b5c16b27baa4b1efa0",
             (allocator *)((long)&gtest_ar.message_.ptr_ + 7));
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar.message_.ptr_ + 7));
  cfd::core::Privkey::GetHex_abi_cxx11_(&local_400,(Privkey *)&sk_c2.is_compressed_);
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
            ((EqHelper<false> *)local_3e0,"exp_sk_c1","sk_c1.GetHex()",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_300,
             &local_400);
  std::__cxx11::string::~string((string *)&local_400);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3e0);
  if (!bVar1) {
    testing::Message::Message(&local_408);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_3e0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_privkey.cpp"
               ,0x153,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_408);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_408);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3e0);
  cfd::core::Privkey::GetHex_abi_cxx11_(&local_440,(Privkey *)&sk_c3.is_compressed_);
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
            ((EqHelper<false> *)local_420,"exp_sk_c2","sk_c2.GetHex()",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_328,
             &local_440);
  std::__cxx11::string::~string((string *)&local_440);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_420);
  if (!bVar1) {
    testing::Message::Message(&local_448);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_420);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_privkey.cpp"
               ,0x154,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_448);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_448);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_420);
  cfd::core::Privkey::GetHex_abi_cxx11_(&local_480,(Privkey *)&sk_c4.is_compressed_);
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
            ((EqHelper<false> *)local_460,"exp_sk_c3","sk_c3.GetHex()",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_350,
             &local_480);
  std::__cxx11::string::~string((string *)&local_480);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_460);
  if (!bVar1) {
    testing::Message::Message(&local_488);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_460);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_privkey.cpp"
               ,0x155,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_488);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_488);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_460);
  cfd::core::Privkey::GetHex_abi_cxx11_(&local_4c0,(Privkey *)&sk_m1.is_compressed_);
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
            ((EqHelper<false> *)local_4a0,"exp_sk_c4","sk_c4.GetHex()",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_378,
             &local_4c0);
  std::__cxx11::string::~string((string *)&local_4c0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4a0);
  if (!bVar1) {
    testing::Message::Message(&local_4c8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_4a0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_privkey.cpp"
               ,0x156,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_4c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_4c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4a0);
  cfd::core::Privkey::GetHex_abi_cxx11_(&local_500,(Privkey *)&sk_m2.is_compressed_);
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
            ((EqHelper<false> *)local_4e0,"exp_sk_m1","sk_m1.GetHex()",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3a0,
             &local_500);
  std::__cxx11::string::~string((string *)&local_500);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4e0);
  if (!bVar1) {
    testing::Message::Message(&local_508);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_4e0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_privkey.cpp"
               ,0x157,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_508);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_508);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4e0);
  cfd::core::Privkey::GetHex_abi_cxx11_(&local_540,(Privkey *)&sk_c5.is_compressed_);
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
            ((EqHelper<false> *)local_520,"exp_sk_m2","sk_m2.GetHex()",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3c8,
             &local_540);
  std::__cxx11::string::~string((string *)&local_540);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_520);
  if (!bVar1) {
    testing::Message::Message(&local_548);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_520);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_privkey.cpp"
               ,0x158,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,&local_548);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
    testing::Message::~Message(&local_548);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_520);
  cfd::core::Privkey::GetHex_abi_cxx11_(&local_580,(Privkey *)&sk_c6.is_compressed_);
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
            ((EqHelper<false> *)local_560,"exp_sk_c1","sk_c5.GetHex()",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_300,
             &local_580);
  std::__cxx11::string::~string((string *)&local_580);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_560);
  if (!bVar1) {
    testing::Message::Message(&local_588);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_560);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_privkey.cpp"
               ,0x15a,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7.message_,&local_588);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
    testing::Message::~Message(&local_588);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_560);
  cfd::core::Privkey::GetHex_abi_cxx11_(&local_5c0,(Privkey *)local_220);
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
            ((EqHelper<false> *)local_5a0,"exp_sk_c3","sk_c6.GetHex()",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_350,
             &local_5c0);
  std::__cxx11::string::~string((string *)&local_5c0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5a0);
  if (!bVar1) {
    testing::Message::Message(&local_5c8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_5a0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_8.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_privkey.cpp"
               ,0x15b,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_8.message_,&local_5c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_8.message_);
    testing::Message::~Message(&local_5c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_5a0);
  cfd::core::Privkey::GetHex_abi_cxx11_(&local_600,(Privkey *)&sk_m4.is_compressed_);
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
            ((EqHelper<false> *)local_5e0,"exp_sk_m1","sk_m3.GetHex()",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3a0,
             &local_600);
  std::__cxx11::string::~string((string *)&local_600);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5e0);
  if (!bVar1) {
    testing::Message::Message(&local_608);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_5e0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_9.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_privkey.cpp"
               ,0x15c,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_9.message_,&local_608);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_9.message_);
    testing::Message::~Message(&local_608);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_5e0);
  cfd::core::Privkey::GetHex_abi_cxx11_(&local_640,(Privkey *)local_2a0);
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
            ((EqHelper<false> *)local_620,"exp_sk_m2","sk_m4.GetHex()",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3c8,
             &local_640);
  std::__cxx11::string::~string((string *)&local_640);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_620);
  if (!bVar1) {
    testing::Message::Message(&local_648);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_620);
    testing::internal::AssertHelper::AssertHelper
              (&local_650,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_privkey.cpp"
               ,0x15d,pcVar2);
    testing::internal::AssertHelper::operator=(&local_650,&local_648);
    testing::internal::AssertHelper::~AssertHelper(&local_650);
    testing::Message::~Message(&local_648);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_620);
  std::__cxx11::string::~string((string *)local_3c8);
  std::__cxx11::string::~string((string *)local_3a0);
  std::__cxx11::string::~string((string *)local_378);
  std::__cxx11::string::~string((string *)local_350);
  std::__cxx11::string::~string((string *)local_328);
  std::__cxx11::string::~string((string *)local_300);
  cfd::core::Privkey::~Privkey((Privkey *)local_2a0);
  cfd::core::Privkey::~Privkey((Privkey *)&sk_m4.is_compressed_);
  cfd::core::Privkey::~Privkey((Privkey *)local_220);
  cfd::core::Privkey::~Privkey((Privkey *)&sk_c6.is_compressed_);
  cfd::core::Privkey::~Privkey((Privkey *)&sk_c5.is_compressed_);
  cfd::core::Privkey::~Privkey((Privkey *)&sk_m2.is_compressed_);
  cfd::core::Privkey::~Privkey((Privkey *)&sk_m1.is_compressed_);
  cfd::core::Privkey::~Privkey((Privkey *)&sk_c4.is_compressed_);
  cfd::core::Privkey::~Privkey((Privkey *)&sk_c3.is_compressed_);
  cfd::core::Privkey::~Privkey((Privkey *)&sk_c2.is_compressed_);
  cfd::core::Pubkey::~Pubkey((Pubkey *)&sk_c1.is_compressed_);
  cfd::core::Pubkey::~Pubkey
            ((Pubkey *)
             &pk_b.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  cfd::core::ByteData256::~ByteData256((ByteData256 *)local_c8);
  cfd::core::Privkey::~Privkey((Privkey *)local_88);
  cfd::core::Privkey::~Privkey((Privkey *)local_30);
  return;
}

Assistant:

TEST(Privkey, TweakTest) {
  // https://planethouki.wordpress.com/2018/03/15/pubkey-add-ecdsa/
  Privkey sk_a("1d52f68124c59c3125d5c2e043cabf01cef46fafaf45be3132fc1f52ff0ec434");
  Privkey sk_b("353a88e3c404380d9970d9b2d8ee9f6051b3d817ab32aabc12f5c3c65086e659");
  ByteData256 tweak("353a88e3c404380d9970d9b2d8ee9f6051b3d817ab32aabc12f5c3c65086e659");

  auto pk_a = sk_a.GetPubkey();
  auto pk_b = sk_b.GetPubkey();

  auto sk_c1 = sk_a + sk_b;
  auto sk_c2 = sk_a - sk_b;
  auto sk_c3 = sk_a + tweak;
  auto sk_c4 = sk_a - tweak;
  auto sk_m1 = sk_a * sk_b;
  auto sk_m2 = sk_a * tweak;

  Privkey sk_c5 = sk_a;
  Privkey sk_c6 = sk_a;
  sk_c5 += sk_b;
  sk_c6 += tweak;

  Privkey sk_m3 = sk_a;
  Privkey sk_m4 = sk_a;
  sk_m3 *= sk_b;
  sk_m4 *= tweak;

  std::string exp_sk_c1 = "528d7f64e8c9d43ebf469c931cb95e6220a847c75a7868ed45f1e3194f95aa8d";
  std::string exp_sk_c2 = "e8186d9d60c164238c64e92d6adc1fa037ef747eb35bb3b0dfd8ba197ebe1f1c";
  std::string exp_sk_c3 = "528d7f64e8c9d43ebf469c931cb95e6220a847c75a7868ed45f1e3194f95aa8d";
  std::string exp_sk_c4 = "e8186d9d60c164238c64e92d6adc1fa037ef747eb35bb3b0dfd8ba197ebe1f1c";
  std::string exp_sk_m1 = "5ef544d2eb21fcabf9d31d103631fd6da8a653a118e086b5c16b27baa4b1efa0";
  std::string exp_sk_m2 = "5ef544d2eb21fcabf9d31d103631fd6da8a653a118e086b5c16b27baa4b1efa0";

  EXPECT_EQ(exp_sk_c1, sk_c1.GetHex());
  EXPECT_EQ(exp_sk_c2, sk_c2.GetHex());
  EXPECT_EQ(exp_sk_c3, sk_c3.GetHex());
  EXPECT_EQ(exp_sk_c4, sk_c4.GetHex());
  EXPECT_EQ(exp_sk_m1, sk_m1.GetHex());
  EXPECT_EQ(exp_sk_m2, sk_m2.GetHex());

  EXPECT_EQ(exp_sk_c1, sk_c5.GetHex());
  EXPECT_EQ(exp_sk_c3, sk_c6.GetHex());
  EXPECT_EQ(exp_sk_m1, sk_m3.GetHex());
  EXPECT_EQ(exp_sk_m2, sk_m4.GetHex());
}